

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

char * zt_cstr_cat(char *s1,ssize_t i1,ssize_t j1,char *s2,ssize_t i2,ssize_t j2)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  sVar1 = strlen(s1);
  if (sVar1 == 0) {
    lVar9 = 0;
    lVar8 = 0;
  }
  else {
    if (i1 < 0) {
      lVar5 = sVar1 - 1;
      if ((long)(i1 + sVar1) < (long)sVar1) {
        lVar5 = i1 + sVar1;
      }
    }
    else {
      lVar5 = sVar1 - 1;
      if (i1 < (long)sVar1) {
        lVar5 = i1;
      }
    }
    if (j1 < 0) {
      lVar8 = sVar1 - 1;
      if ((long)(j1 + sVar1) < (long)sVar1) {
        lVar8 = j1 + sVar1;
      }
    }
    else {
      lVar8 = sVar1 - 1;
      if (j1 < (long)sVar1) {
        lVar8 = j1;
      }
    }
    lVar9 = lVar8;
    if (lVar8 < lVar5) {
      lVar9 = lVar5;
    }
    if (lVar5 < lVar8) {
      lVar8 = lVar5;
    }
  }
  sVar1 = strlen(s2);
  if (sVar1 == 0) {
    lVar10 = 0;
    lVar5 = 0;
  }
  else {
    if (i2 < 0) {
      lVar7 = sVar1 - 1;
      if ((long)(i2 + sVar1) < (long)sVar1) {
        lVar7 = i2 + sVar1;
      }
    }
    else {
      lVar7 = sVar1 - 1;
      if (i2 < (long)sVar1) {
        lVar7 = i2;
      }
    }
    if (j2 < 0) {
      lVar5 = sVar1 - 1;
      if ((long)(j2 + sVar1) < (long)sVar1) {
        lVar5 = j2 + sVar1;
      }
    }
    else {
      lVar5 = sVar1 - 1;
      if (j2 < (long)sVar1) {
        lVar5 = j2;
      }
    }
    lVar10 = lVar5;
    if (lVar5 < lVar7) {
      lVar10 = lVar7;
    }
    if (lVar7 < lVar5) {
      lVar5 = lVar7;
    }
  }
  lVar2 = lVar8 - lVar9;
  lVar7 = -lVar2;
  if (0 < lVar2) {
    lVar7 = lVar2;
  }
  lVar3 = lVar5 - lVar10;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  pcVar4 = (char *)zt_malloc_p(lVar7 + lVar2 + 3);
  pcVar6 = pcVar4;
  if (lVar8 <= lVar9) {
    lVar7 = 0;
    do {
      pcVar4[lVar7] = s1[lVar7 + lVar8];
      lVar7 = lVar7 + 1;
    } while ((lVar9 - lVar8) + 1 != lVar7);
    pcVar6 = pcVar4 + lVar7;
  }
  if (lVar5 <= lVar10) {
    lVar8 = 0;
    do {
      pcVar6[lVar8] = s2[lVar8 + lVar5];
      lVar8 = lVar8 + 1;
    } while ((lVar10 - lVar5) + 1 != lVar8);
    pcVar6 = pcVar6 + lVar8;
  }
  *pcVar6 = '\0';
  return pcVar4;
}

Assistant:

char *
zt_cstr_cat(const char *s1, ssize_t i1, ssize_t j1,
            const char *s2, ssize_t i2, ssize_t j2) {
    char * new;
    char * p;

    CONVERT(s1, i1, j1);
    CONVERT(s2, i2, j2);

    p = new = zt_malloc(char, IDXLEN(i1, j1) + IDXLEN(i2, j2) + 1);

    while (i1 <= j1) {
        *p++ = s1[i1++];
    }

    while (i2 <= j2) {
        *p++ = s2[i2++];
    }

    *p = '\0';
    return new;
}